

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterop.cpp
# Opt level: O0

void anon_unknown.dwarf_d07c3::testInteropMx4(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  float *pfVar4;
  Matrix44<float> v;
  int i;
  int j;
  SimpleMx<float,_4> s;
  Matrix44<float> ref;
  Matrix44<float> local_c8;
  int local_88;
  int local_84;
  SimpleMx<float,_4> *in_stack_ffffffffffffffa8;
  Matrix44<float> *in_stack_ffffffffffffffb0;
  SimpleMx<float,_4> *in_stack_ffffffffffffffe8;
  Matrix44<float> *in_stack_fffffffffffffff0;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,4>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<int,4>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,4>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyzw<float>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyz_wrong<float>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xffffffffffffffc0);
  SimpleMx<float,_4>::SimpleMx((SimpleMx<float,_4> *)&stack0xffffffffffffff80,0.0);
  for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      iVar2 = local_88 + local_84 * 4;
      pfVar4 = SimpleMx<float,_4>::operator[]
                         ((SimpleMx<float,_4> *)&stack0xffffffffffffff80,local_84);
      pfVar4[local_88] = (float)iVar2;
      iVar2 = local_88 + local_84 * 4;
      pfVar4 = Imath_3_2::Matrix44<float>::operator[]
                         ((Matrix44<float> *)&stack0xffffffffffffffc0,local_84);
      pfVar4[local_88] = (float)iVar2;
    }
  }
  Imath_3_2::Matrix44<float>::Matrix44<(anonymous_namespace)::SimpleMx<float,_4>,_0>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
      bVar1 = false;
      if ((pfVar4[2] == 2.0) && (!NAN(pfVar4[2]))) {
        pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
        bVar1 = false;
        if ((pfVar4[3] == 3.0) && (!NAN(pfVar4[3]))) {
          pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
          bVar1 = false;
          if ((*pfVar4 == 4.0) && (!NAN(*pfVar4))) {
            pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
            bVar1 = false;
            if ((pfVar4[1] == 5.0) && (!NAN(pfVar4[1]))) {
              pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
              bVar1 = false;
              if ((pfVar4[2] == 6.0) && (!NAN(pfVar4[2]))) {
                pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
                bVar1 = false;
                if ((pfVar4[3] == 7.0) && (!NAN(pfVar4[3]))) {
                  pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                  bVar1 = false;
                  if ((*pfVar4 == 8.0) && (!NAN(*pfVar4))) {
                    pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                    bVar1 = false;
                    if ((pfVar4[1] == 9.0) && (!NAN(pfVar4[1]))) {
                      pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                      bVar1 = false;
                      if ((pfVar4[2] == 10.0) && (!NAN(pfVar4[2]))) {
                        pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                        bVar1 = false;
                        if ((pfVar4[3] == 11.0) && (!NAN(pfVar4[3]))) {
                          pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                          bVar1 = false;
                          if ((*pfVar4 == 12.0) && (!NAN(*pfVar4))) {
                            pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                            bVar1 = false;
                            if ((pfVar4[1] == 13.0) && (!NAN(pfVar4[1]))) {
                              pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                              bVar1 = false;
                              if ((pfVar4[2] == 14.0) && (!NAN(pfVar4[2]))) {
                                pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                                bVar1 = pfVar4[3] == 15.0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[0][3] == 3 && v[1][0] == 4 && v[1][1] == 5 && v[1][2] == 6 && v[1][3] == 7 && v[2][0] == 8 && v[2][1] == 9 && v[2][2] == 10 && v[2][3] == 11 && v[3][0] == 12 && v[3][1] == 13 && v[3][2] == 14 && v[3][3] == 15"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x2b0,"void (anonymous namespace)::testInteropMx4()");
  }
  pfVar4 = SimpleMx<float,_4>::operator[]((SimpleMx<float,_4> *)&stack0xffffffffffffff80,1);
  pfVar4[1] = 42.0;
  Imath_3_2::Matrix44<float>::operator=<(anonymous_namespace)::SimpleMx<float,_4>,_0>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
      bVar1 = false;
      if ((pfVar4[2] == 2.0) && (!NAN(pfVar4[2]))) {
        pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,0);
        bVar1 = false;
        if ((pfVar4[3] == 3.0) && (!NAN(pfVar4[3]))) {
          pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
          bVar1 = false;
          if ((*pfVar4 == 4.0) && (!NAN(*pfVar4))) {
            pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
            bVar1 = false;
            if ((pfVar4[1] == 42.0) && (!NAN(pfVar4[1]))) {
              pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
              bVar1 = false;
              if ((pfVar4[2] == 6.0) && (!NAN(pfVar4[2]))) {
                pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,1);
                bVar1 = false;
                if ((pfVar4[3] == 7.0) && (!NAN(pfVar4[3]))) {
                  pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                  bVar1 = false;
                  if ((*pfVar4 == 8.0) && (!NAN(*pfVar4))) {
                    pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                    bVar1 = false;
                    if ((pfVar4[1] == 9.0) && (!NAN(pfVar4[1]))) {
                      pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                      bVar1 = false;
                      if ((pfVar4[2] == 10.0) && (!NAN(pfVar4[2]))) {
                        pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,2);
                        bVar1 = false;
                        if ((pfVar4[3] == 11.0) && (!NAN(pfVar4[3]))) {
                          pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                          bVar1 = false;
                          if ((*pfVar4 == 12.0) && (!NAN(*pfVar4))) {
                            pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                            bVar1 = false;
                            if ((pfVar4[1] == 13.0) && (!NAN(pfVar4[1]))) {
                              pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                              bVar1 = false;
                              if ((pfVar4[2] == 14.0) && (!NAN(pfVar4[2]))) {
                                pfVar4 = Imath_3_2::Matrix44<float>::operator[](&local_c8,3);
                                bVar1 = pfVar4[3] == 15.0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[0][3] == 3 && v[1][0] == 4 && v[1][1] == 42 && v[1][2] == 6 && v[1][3] == 7 && v[2][0] == 8 && v[2][1] == 9 && v[2][2] == 10 && v[2][3] == 11 && v[3][0] == 12 && v[3][1] == 13 && v[3][2] == 14 && v[3][3] == 15"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x2b7,"void (anonymous namespace)::testInteropMx4()");
  }
  return;
}

Assistant:

void
testInteropMx4 ()
{
    std::cout
        << "has_double_subscript<SimpleMx<float,4>, float, 4, 4>::value = "
        << has_double_subscript<SimpleMx<float, 4>, float, 4, 4>::value << "\n";
    std::cout << "has_double_subscript<SimpleMx<int,4>, float, 4, 4>::value = "
              << has_double_subscript<SimpleMx<int, 4>, float, 4, 4>::value
              << "\n";
    std::cout
        << "has_double_subscript<SimpleMx<float,4>, float, 4, 4>::value = "
        << has_double_subscript<SimpleMx<float, 4>, float, 4, 4>::value << "\n";
    std::cout << "has_double_subscript<xyzw<float>, float, 4, 4>::value = "
              << has_double_subscript<xyzw<float>, float, 4, 4>::value << "\n";
    std::cout << "has_double_subscript<xyz_wrong<float>, float, 4, 4>::value = "
              << has_double_subscript<xyz_wrong<float>, float, 4, 4>::value
              << "\n";
    std::cout << "\n";

    assert ((has_double_subscript<SimpleMx<float, 4>, float, 4, 4>::value));
    assert ((!has_double_subscript<SimpleMx<float, 4>, float, 3, 3>::value));
    assert ((!has_double_subscript<SimpleMx<float, 4>, int, 4, 4>::value));
    assert ((!has_double_subscript<xyzw<float>, float, 4, 4>::value));
    assert ((!has_double_subscript<xy<float>, float, 4, 4>::value));

    // Test construction/assignment/paramater pass of a vector type with
    // subscripting to access components.
    {
        Matrix44<float>    ref;
        SimpleMx<float, 4> s;
        for (int j = 0; j < 4; ++j)
            for (int i = 0; i < 4; ++i)
            {
                s[j][i]   = float(i + j * 4);
                ref[j][i] = float(i + j * 4);
            }
        Matrix44<float> v (s);
        assert (
            v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[0][3] == 3 &&
            v[1][0] == 4 && v[1][1] == 5 && v[1][2] == 6 && v[1][3] == 7 &&
            v[2][0] == 8 && v[2][1] == 9 && v[2][2] == 10 && v[2][3] == 11 &&
            v[3][0] == 12 && v[3][1] == 13 && v[3][2] == 14 && v[3][3] == 15);
        s[1][1] = 42;
        v       = s;
        assert (
            v[0][0] == 0 && v[0][1] == 1 && v[0][2] == 2 && v[0][3] == 3 &&
            v[1][0] == 4 && v[1][1] == 42 && v[1][2] == 6 && v[1][3] == 7 &&
            v[2][0] == 8 && v[2][1] == 9 && v[2][2] == 10 && v[2][3] == 11 &&
            v[3][0] == 12 && v[3][1] == 13 && v[3][2] == 14 && v[3][3] == 15);
    }
}